

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filepath_tests.cpp
# Opt level: O0

void __thiscall
iu_FilePath_x_iutest_x_ConcatPaths_Test::~iu_FilePath_x_iutest_x_ConcatPaths_Test
          (iu_FilePath_x_iutest_x_ConcatPaths_Test *this)

{
  iu_FilePath_x_iutest_x_ConcatPaths_Test *this_local;
  
  ~iu_FilePath_x_iutest_x_ConcatPaths_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

IUTEST(FilePath, ConcatPaths)
{
    {
        ::iutest::internal::FilePath a("a");
        ::iutest::internal::FilePath empty;
        IUTEST_EXPECT_EQ("a", ::iutest::internal::FilePath::ConcatPaths(empty, a));
#ifdef IUTEST_OS_WINDOWS
        IUTEST_EXPECT_EQ("a\\", ::iutest::internal::FilePath::ConcatPaths(a, empty));
#else
        IUTEST_EXPECT_EQ("a/", ::iutest::internal::FilePath::ConcatPaths(a, empty));
#endif
    }
    {
        ::iutest::internal::FilePath dir("path/to/dir/////");
        ::iutest::internal::FilePath file("test.text");
#ifdef IUTEST_OS_WINDOWS
        IUTEST_EXPECT_EQ("path\\to\\dir\\test.text", ::iutest::internal::FilePath::ConcatPaths(dir, file));
#else
        IUTEST_EXPECT_EQ("path/to/dir/test.text", ::iutest::internal::FilePath::ConcatPaths(dir, file));
#endif
    }
}